

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::GetNodeStateStats
          (PeerManagerImpl *this,NodeId nodeid,CNodeStateStats *stats)

{
  bool bVar1;
  __int_type _Var2;
  CNodeState *pCVar3;
  reference pQVar4;
  ServiceFlags SVar5;
  __int_type_conflict1 _Var6;
  rep rVar7;
  TxRelay *pTVar8;
  element_type *peVar9;
  int64_t iVar10;
  duration<long,_std::ratio<1L,_1L>_> dVar11;
  int *in_RDX;
  long in_FS_OFFSET;
  QueuedBlock *queue;
  list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
  *__range1;
  CNodeState *state;
  memory_order __b;
  memory_order __b_2;
  memory_order __b_1;
  TxRelay *tx_relay;
  microseconds ping_wait;
  PeerRef peer;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock36;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock34;
  __memory_order_modifier in_stack_fffffffffffffe58;
  memory_order in_stack_fffffffffffffe5c;
  Peer *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  memory_order in_stack_fffffffffffffe6c;
  __atomic_base<unsigned_long> *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  undefined1 *puVar12;
  char *in_stack_fffffffffffffe80;
  memory_order __m;
  atomic<unsigned_long> *pszFile;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 uVar13;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffe90;
  atomic<unsigned_long> *mutexIn;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int local_130;
  int local_12c;
  byte local_d1;
  rep local_50;
  undefined1 local_48 [16];
  _List_node_base *local_38;
  _List_node_base *local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),in_stack_fffffffffffffe90
             ,(char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe78 >> 0x18,0));
  pCVar3 = State((PeerManagerImpl *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  __m = (memory_order)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  if (pCVar3 == (CNodeState *)0x0) {
    local_d1 = 0;
    bVar1 = true;
  }
  else {
    if (pCVar3->pindexBestKnownBlock == (CBlockIndex *)0x0) {
      local_12c = -1;
    }
    else {
      local_12c = pCVar3->pindexBestKnownBlock->nHeight;
    }
    *in_RDX = local_12c;
    if (pCVar3->pindexLastCommonBlock == (CBlockIndex *)0x0) {
      local_130 = -1;
    }
    else {
      local_130 = pCVar3->pindexLastCommonBlock->nHeight;
    }
    in_RDX[1] = local_130;
    local_30 = (_List_node_base *)
               std::__cxx11::
               list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
               ::begin((list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                        *)in_stack_fffffffffffffe60);
    local_38 = (_List_node_base *)
               std::__cxx11::
               list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
               ::end((list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                      *)in_stack_fffffffffffffe60);
    while( true ) {
      bVar1 = std::operator==((_Self *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                              ,(_Self *)in_stack_fffffffffffffe60);
      __m = (memory_order)((ulong)in_stack_fffffffffffffe80 >> 0x20);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pQVar4 = std::_List_const_iterator<(anonymous_namespace)::QueuedBlock>::operator*
                         ((_List_const_iterator<(anonymous_namespace)::QueuedBlock> *)
                          CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      if (pQVar4->pindex != (CBlockIndex *)0x0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                   (value_type_conflict4 *)in_stack_fffffffffffffe60);
      }
      std::_List_const_iterator<(anonymous_namespace)::QueuedBlock>::operator++
                ((_List_const_iterator<(anonymous_namespace)::QueuedBlock> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
    bVar1 = false;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  if (!bVar1) {
    GetPeerRef((PeerManagerImpl *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    bVar1 = std::operator==((shared_ptr<(anonymous_namespace)::Peer> *)
                            CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                            in_stack_fffffffffffffe60);
    if (bVar1) {
      local_d1 = 0;
    }
    else {
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      SVar5 = std::atomic::operator_cast_to_ServiceFlags
                        ((atomic<ServiceFlags> *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      *(ServiceFlags *)(in_RDX + 0x16) = SVar5;
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      _Var2 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_fffffffffffffe70);
      in_RDX[2] = _Var2;
      memset(&local_50,0,8);
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      _Var6 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffe70);
      bVar1 = false;
      if (_Var6 != 0) {
        std::
        __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        std::atomic<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>::load
                  ((atomic<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),__m);
        rVar7 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                          ((duration<long,_std::ratio<1L,_1000000L>_> *)
                           CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        bVar1 = rVar7 != 0;
      }
      if (bVar1) {
        GetTime<std::chrono::duration<long,std::ratio<1l,1000000l>>>();
        std::
        __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        std::atomic<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>::load
                  ((atomic<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),__m);
        local_50 = (rep)std::chrono::operator-
                                  ((duration<long,_std::ratio<1L,_1000000L>_> *)
                                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                   (duration<long,_std::ratio<1L,_1000000L>_> *)
                                   in_stack_fffffffffffffe60);
      }
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      pTVar8 = Peer::GetTxRelay(in_stack_fffffffffffffe60);
      if (pTVar8 == (TxRelay *)0x0) {
        *(undefined1 *)(in_RDX + 0xc) = 0;
        in_RDX[0xe] = 0;
        in_RDX[0xf] = 0;
      }
      else {
        MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                  ((AnnotatedMixin<std::recursive_mutex> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        bVar1 = GetNodeStateStats::anon_class_8_1_6e72a694::operator()
                          ((anon_class_8_1_6e72a694 *)
                           CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        *(bool *)(in_RDX + 0xc) = bVar1;
        std::operator&(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
        *(__int_type_conflict2 *)(in_RDX + 0xe) =
             (pTVar8->m_fee_filter_received).super___atomic_base<long>._M_i;
      }
      *(rep *)(in_RDX + 4) = local_50;
      peVar9 = std::
               __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      mutexIn = &peVar9->m_addr_processed;
      std::operator&(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
      uVar14 = 5;
      *(__int_type_conflict1 *)(in_RDX + 0x10) = (mutexIn->super___atomic_base<unsigned_long>)._M_i;
      peVar9 = std::
               __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      pszFile = &peVar9->m_addr_rate_limited;
      std::operator&(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
      uVar13 = 5;
      *(__int_type_conflict1 *)(in_RDX + 0x12) = (pszFile->super___atomic_base<unsigned_long>)._M_i;
      puVar12 = local_48;
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      bVar1 = std::atomic<bool>::load
                        ((atomic<bool> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      *(bool *)(in_RDX + 0x14) = bVar1;
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                 CONCAT44(uVar14,in_stack_fffffffffffffe98),(AnnotatedMixin<std::mutex> *)mutexIn,
                 (char *)CONCAT44(uVar13,in_stack_fffffffffffffe88),(char *)pszFile,
                 (int)((ulong)puVar12 >> 0x20),SUB81((ulong)puVar12 >> 0x18,0));
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      if (bVar1) {
        std::
        __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
                  ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        iVar10 = HeadersSyncState::GetPresyncHeight
                           ((HeadersSyncState *)
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        *(int64_t *)(in_RDX + 0x18) = iVar10;
      }
      UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      dVar11 = std::atomic::operator_cast_to_duration
                         ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                          in_stack_fffffffffffffe60);
      *(rep *)(in_RDX + 0x1a) = dVar11.__r;
      local_d1 = 1;
    }
    std::shared_ptr<(anonymous_namespace)::Peer>::~shared_ptr
              ((shared_ptr<(anonymous_namespace)::Peer> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_d1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::GetNodeStateStats(NodeId nodeid, CNodeStateStats& stats) const
{
    {
        LOCK(cs_main);
        const CNodeState* state = State(nodeid);
        if (state == nullptr)
            return false;
        stats.nSyncHeight = state->pindexBestKnownBlock ? state->pindexBestKnownBlock->nHeight : -1;
        stats.nCommonHeight = state->pindexLastCommonBlock ? state->pindexLastCommonBlock->nHeight : -1;
        for (const QueuedBlock& queue : state->vBlocksInFlight) {
            if (queue.pindex)
                stats.vHeightInFlight.push_back(queue.pindex->nHeight);
        }
    }

    PeerRef peer = GetPeerRef(nodeid);
    if (peer == nullptr) return false;
    stats.their_services = peer->m_their_services;
    stats.m_starting_height = peer->m_starting_height;
    // It is common for nodes with good ping times to suddenly become lagged,
    // due to a new block arriving or other large transfer.
    // Merely reporting pingtime might fool the caller into thinking the node was still responsive,
    // since pingtime does not update until the ping is complete, which might take a while.
    // So, if a ping is taking an unusually long time in flight,
    // the caller can immediately detect that this is happening.
    auto ping_wait{0us};
    if ((0 != peer->m_ping_nonce_sent) && (0 != peer->m_ping_start.load().count())) {
        ping_wait = GetTime<std::chrono::microseconds>() - peer->m_ping_start.load();
    }

    if (auto tx_relay = peer->GetTxRelay(); tx_relay != nullptr) {
        stats.m_relay_txs = WITH_LOCK(tx_relay->m_bloom_filter_mutex, return tx_relay->m_relay_txs);
        stats.m_fee_filter_received = tx_relay->m_fee_filter_received.load();
    } else {
        stats.m_relay_txs = false;
        stats.m_fee_filter_received = 0;
    }

    stats.m_ping_wait = ping_wait;
    stats.m_addr_processed = peer->m_addr_processed.load();
    stats.m_addr_rate_limited = peer->m_addr_rate_limited.load();
    stats.m_addr_relay_enabled = peer->m_addr_relay_enabled.load();
    {
        LOCK(peer->m_headers_sync_mutex);
        if (peer->m_headers_sync) {
            stats.presync_height = peer->m_headers_sync->GetPresyncHeight();
        }
    }
    stats.time_offset = peer->m_time_offset;

    return true;
}